

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menuinput.cpp
# Opt level: O2

void __thiscall DTextEnterMenu::Drawer(DTextEnterMenu *this)

{
  EColorRange range;
  int iVar1;
  FFont *font;
  undefined4 uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  DMenu *pDVar8;
  undefined4 extraout_var;
  FRemapTable *pFVar9;
  uint y;
  ulong uVar10;
  uint uVar11;
  long lVar12;
  ulong uVar13;
  uint uVar14;
  int iVar15;
  int iVar16;
  uint uVar17;
  BYTE *string;
  int width;
  DFrameBuffer *local_80;
  DTextEnterMenu *local_78;
  long local_70;
  ulong local_68;
  ulong local_60;
  uint local_58;
  uint local_54;
  uint local_50;
  uint local_4c;
  ulong local_48;
  double local_40;
  ulong local_38;
  
  pDVar8 = GC::ReadBarrier<DMenu>((DMenu **)&(this->super_DMenu).mParentMenu);
  (*(pDVar8->super_DObject)._vptr_DObject[10])(pDVar8);
  iVar1 = CleanYfac;
  iVar6 = CleanXfac;
  local_78 = this;
  if (this->mInputGridOkay == true) {
    iVar3 = CleanXfac * 0x12;
    iVar4 = CleanYfac * 0xc;
    iVar5 = SmallFont->FontHeight * CleanYfac;
    (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0xe])
              (0x3f4ccccd,screen,0,0,
               (ulong)(uint)((screen->super_DSimpleCanvas).super_DCanvas.Height + CleanYfac * -0x3c)
               ,(ulong)(uint)(screen->super_DSimpleCanvas).super_DCanvas.Width);
    if ((-1 < local_78->InputGridX) && (-1 < local_78->InputGridY)) {
      (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0xe])
                (0x3f19999a,screen,0xfff8dc,
                 (ulong)(uint)((local_78->InputGridX * iVar3 - (iVar6 * 0xea >> 1)) +
                              (screen->super_DSimpleCanvas).super_DCanvas.Width / 2),
                 (ulong)(uint)(local_78->InputGridY * iVar4 + iVar1 * -0x3c +
                              (screen->super_DSimpleCanvas).super_DCanvas.Height));
    }
    local_58 = iVar6 * 9 - (iVar6 * 0xea >> 1);
    lVar12 = 0;
    uVar10 = 0;
    while (uVar10 != 5) {
      y = iVar4 * (int)uVar10 + iVar1 * -0x36 + (screen->super_DSimpleCanvas).super_DCanvas.Height +
          iVar5 / -2;
      local_40 = (double)(int)y;
      uVar14 = local_58;
      local_70 = lVar12;
      local_38 = uVar10;
      for (uVar13 = 0; uVar10 = local_38, uVar13 != 0xd; uVar13 = uVar13 + 1) {
        iVar15 = (screen->super_DSimpleCanvas).super_DCanvas.Width / 2;
        local_68 = (ulong)uVar14;
        iVar6 = (*SmallFont->_vptr_FFont[2])
                          (SmallFont,
                           (ulong)(uint)(int)"ABCDEFGHIJKLMNOPQRSTUVWXYZ0123456789+-=.,!?@\'\":;[]()<>^#$%&*/_ \b"
                                             [local_70 + uVar13],&width);
        range = CR_DARKGRAY;
        if ((uint)local_78->InputGridY == uVar10 && (uint)local_78->InputGridX == uVar13) {
          range = CR_YELLOW;
        }
        pFVar9 = FFont::GetColorTranslation(SmallFont,range);
        font = SmallFont;
        iVar16 = (int)local_68;
        if ((FTexture *)CONCAT44(extraout_var,iVar6) == (FTexture *)0x0) {
          if (local_70 + uVar13 == 0x3e) {
            iVar6 = width * CleanXfac * 3;
            iVar15 = iVar15 + iVar6 / -4;
            uVar17 = iVar16 + iVar15;
            uVar7 = iVar6 / 2 + iVar15;
            local_48 = (ulong)uVar7;
            uVar7 = iVar16 + uVar7;
            uVar11 = SmallFont->FontHeight * CleanYfac + y;
            iVar6 = (pFVar9->NumEntries * 2) / 3;
            local_54 = (uint)pFVar9->Remap[iVar6];
            local_80 = (DFrameBuffer *)CONCAT44(local_80._4_4_,pFVar9->Palette[iVar6].field_0.d);
            local_60 = uVar13;
            local_50 = uVar17;
            local_4c = uVar7;
            (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x13])
                      (screen,(ulong)uVar17,(ulong)y,(ulong)uVar7,(ulong)(CleanYfac + y),
                       (ulong)pFVar9->Remap[iVar6],pFVar9->Palette[iVar6].field_0.d);
            uVar14 = local_54;
            uVar2 = local_80._0_4_;
            (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x13])
                      (screen,(ulong)uVar17,(ulong)uVar11,(ulong)uVar7,(ulong)(CleanYfac + uVar11),
                       (ulong)local_54,local_80._0_4_);
            iVar16 = (int)local_68;
            (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x13])
                      (screen,(ulong)local_50,(ulong)(CleanYfac + y),
                       (ulong)(uint)(iVar15 + CleanXfac + iVar16),(ulong)uVar11,(ulong)uVar14,uVar2)
            ;
            (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x13])
                      (screen,(ulong)(uint)(((int)local_48 - CleanXfac) + iVar16),
                       (ulong)(CleanYfac + y),(ulong)local_4c,(ulong)uVar11,(ulong)uVar14,
                       local_80._0_4_);
            uVar13 = local_60;
          }
          else if (((int)local_70 + (int)uVar13) - 0x3fU < 2) {
            string = "ED";
            if (local_70 + uVar13 == 0x3f) {
              string = "BS";
            }
            local_80 = screen;
            local_60 = uVar13;
            iVar6 = FFont::StringWidth(SmallFont,string);
            DCanvas::DrawText((DCanvas *)local_80,font,range,
                              iVar15 + iVar16 + (iVar6 * CleanXfac) / -2,y,(char *)string,0x40001393
                              ,1,0);
            uVar13 = local_60;
          }
        }
        else {
          DCanvas::DrawTexture
                    ((DCanvas *)screen,(FTexture *)CONCAT44(extraout_var,iVar6),
                     (double)((CleanXfac * width) / -2 + iVar16 + iVar15),local_40,0x4000138e,pFVar9
                     ,0x40001393,1,0);
        }
        uVar14 = iVar16 + iVar3;
      }
      lVar12 = local_70 + 0xd;
      uVar10 = local_38 + 1;
    }
  }
  DMenu::Drawer(&local_78->super_DMenu);
  return;
}

Assistant:

void DTextEnterMenu::Drawer ()
{
	mParentMenu->Drawer();
	if (mInputGridOkay)
	{
		const int cell_width = 18 * CleanXfac;
		const int cell_height = 12 * CleanYfac;
		const int top_padding = cell_height / 2 - SmallFont->GetHeight() * CleanYfac / 2;

		// Darken the background behind the character grid.
		// Unless we frame it with a border, I think it looks better to extend the
		// background across the full width of the screen.
		screen->Dim(0, 0.8f,
			0 /*screen->GetWidth()/2 - 13 * cell_width / 2*/,
			screen->GetHeight() - INPUTGRID_HEIGHT * cell_height,
			screen->GetWidth() /*13 * cell_width*/,
			INPUTGRID_HEIGHT * cell_height);

		if (InputGridX >= 0 && InputGridY >= 0)
		{
			// Highlight the background behind the selected character.
			screen->Dim(MAKERGB(255,248,220), 0.6f,
				InputGridX * cell_width - INPUTGRID_WIDTH * cell_width / 2 + screen->GetWidth() / 2,
				InputGridY * cell_height - INPUTGRID_HEIGHT * cell_height + screen->GetHeight(),
				cell_width, cell_height);
		}

		for (int y = 0; y < INPUTGRID_HEIGHT; ++y)
		{
			const int yy = y * cell_height - INPUTGRID_HEIGHT * cell_height + screen->GetHeight();
			for (int x = 0; x < INPUTGRID_WIDTH; ++x)
			{
				int width;
				const int xx = x * cell_width - INPUTGRID_WIDTH * cell_width / 2 + screen->GetWidth() / 2;
				const int ch = InputGridChars[y * INPUTGRID_WIDTH + x];
				FTexture *pic = SmallFont->GetChar(ch, &width);
				EColorRange color;
				FRemapTable *remap;

				// The highlighted character is yellow; the rest are dark gray.
				color = (x == InputGridX && y == InputGridY) ? CR_YELLOW : CR_DARKGRAY;
				remap = SmallFont->GetColorTranslation(color);

				if (pic != NULL)
				{
					// Draw a normal character.
					screen->DrawTexture(pic, xx + cell_width/2 - width*CleanXfac/2, yy + top_padding,
						DTA_Translation, remap,
						DTA_CleanNoMove, true,
						TAG_DONE);
				}
				else if (ch == ' ')
				{
					// Draw the space as a box outline. We also draw it 50% wider than it really is.
					const int x1 = xx + cell_width/2 - width * CleanXfac * 3 / 4;
					const int x2 = x1 + width * 3 * CleanXfac / 2;
					const int y1 = yy + top_padding;
					const int y2 = y1 + SmallFont->GetHeight() * CleanYfac;
					const int palentry = remap->Remap[remap->NumEntries*2/3];
					const uint32 palcolor = remap->Palette[remap->NumEntries*2/3];
					screen->Clear(x1, y1, x2, y1+CleanYfac, palentry, palcolor);	// top
					screen->Clear(x1, y2, x2, y2+CleanYfac, palentry, palcolor);	// bottom
					screen->Clear(x1, y1+CleanYfac, x1+CleanXfac, y2, palentry, palcolor);	// left
					screen->Clear(x2-CleanXfac, y1+CleanYfac, x2, y2, palentry, palcolor);	// right
				}
				else if (ch == '\b' || ch == 0)
				{
					// Draw the backspace and end "characters".
					const char *const str = ch == '\b' ? "BS" : "ED";
					screen->DrawText(SmallFont, color,
						xx + cell_width/2 - SmallFont->StringWidth(str)*CleanXfac/2,
						yy + top_padding, str, DTA_CleanNoMove, true, TAG_DONE);
				}
			}
		}
	}
	Super::Drawer();
}